

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathEuler.h
# Opt level: O0

Matrix33<float> * __thiscall Imath_3_2::Euler<float>::toMatrix33(Euler<float> *this)

{
  float *pfVar1;
  Vec3<float> *in_RSI;
  Matrix33<float> *in_RDI;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  double dVar12;
  float ss;
  float sc;
  float cs;
  float cc;
  float sh;
  float sj;
  float si;
  float ch;
  float cj;
  float ci;
  Vec3<float> angles;
  int k;
  int j;
  int i;
  Matrix33<float> *M;
  Vec3<float> local_34;
  Vec3<float> local_28;
  int local_1c;
  int local_18;
  int local_14 [5];
  
  angleOrder((Euler<float> *)in_RSI,local_14,&local_18,&local_1c);
  Vec3<float>::Vec3(&local_28);
  if (((uint)in_RSI[1].x & 1) == 0) {
    Vec3<float>::Vec3(&local_34,in_RSI->z,in_RSI->y,in_RSI->x);
    Vec3<float>::operator=(&local_28,&local_34);
  }
  else {
    Vec3<float>::operator=(&local_28,in_RSI);
  }
  if ((*(byte *)&in_RSI[1].x >> 2 & 1) == 0) {
    Vec3<float>::operator*=(&local_28,-1.0);
  }
  dVar12 = std::cos((double)(ulong)(uint)local_28.x);
  fVar2 = SUB84(dVar12,0);
  dVar12 = std::cos((double)(ulong)(uint)local_28.y);
  fVar3 = SUB84(dVar12,0);
  dVar12 = std::cos((double)(ulong)(uint)local_28.z);
  fVar4 = SUB84(dVar12,0);
  dVar12 = std::sin((double)(ulong)(uint)local_28.x);
  fVar5 = SUB84(dVar12,0);
  dVar12 = std::sin((double)(ulong)(uint)local_28.y);
  fVar6 = SUB84(dVar12,0);
  dVar12 = std::sin((double)(ulong)(uint)local_28.z);
  fVar7 = SUB84(dVar12,0);
  fVar8 = fVar2 * fVar4;
  fVar9 = fVar2 * fVar7;
  fVar10 = fVar5 * fVar4;
  fVar11 = fVar5 * fVar7;
  Matrix33<float>::Matrix33(in_RDI);
  if ((*(byte *)&in_RSI[1].x >> 1 & 1) == 0) {
    pfVar1 = Matrix33<float>::operator[](in_RDI,local_14[0]);
    pfVar1[local_14[0]] = fVar3 * fVar4;
    pfVar1 = Matrix33<float>::operator[](in_RDI,local_18);
    pfVar1[local_14[0]] = fVar6 * fVar10 + -fVar9;
    pfVar1 = Matrix33<float>::operator[](in_RDI,local_1c);
    pfVar1[local_14[0]] = fVar6 * fVar8 + fVar11;
    pfVar1 = Matrix33<float>::operator[](in_RDI,local_14[0]);
    pfVar1[local_18] = fVar3 * fVar7;
    pfVar1 = Matrix33<float>::operator[](in_RDI,local_18);
    pfVar1[local_18] = fVar6 * fVar11 + fVar8;
    pfVar1 = Matrix33<float>::operator[](in_RDI,local_1c);
    pfVar1[local_18] = fVar6 * fVar9 + -fVar10;
    pfVar1 = Matrix33<float>::operator[](in_RDI,local_14[0]);
    pfVar1[local_1c] = -fVar6;
    pfVar1 = Matrix33<float>::operator[](in_RDI,local_18);
    pfVar1[local_1c] = fVar3 * fVar5;
    pfVar1 = Matrix33<float>::operator[](in_RDI,local_1c);
    pfVar1[local_1c] = fVar3 * fVar2;
  }
  else {
    pfVar1 = Matrix33<float>::operator[](in_RDI,local_14[0]);
    pfVar1[local_14[0]] = fVar3;
    pfVar1 = Matrix33<float>::operator[](in_RDI,local_18);
    pfVar1[local_14[0]] = fVar6 * fVar5;
    pfVar1 = Matrix33<float>::operator[](in_RDI,local_1c);
    pfVar1[local_14[0]] = fVar6 * fVar2;
    pfVar1 = Matrix33<float>::operator[](in_RDI,local_14[0]);
    pfVar1[local_18] = fVar6 * fVar7;
    pfVar1 = Matrix33<float>::operator[](in_RDI,local_18);
    pfVar1[local_18] = -fVar3 * fVar11 + fVar8;
    pfVar1 = Matrix33<float>::operator[](in_RDI,local_1c);
    pfVar1[local_18] = -fVar3 * fVar9 + -fVar10;
    pfVar1 = Matrix33<float>::operator[](in_RDI,local_14[0]);
    pfVar1[local_1c] = -fVar6 * fVar4;
    pfVar1 = Matrix33<float>::operator[](in_RDI,local_18);
    pfVar1[local_1c] = fVar3 * fVar10 + fVar9;
    pfVar1 = Matrix33<float>::operator[](in_RDI,local_1c);
    pfVar1[local_1c] = fVar3 * fVar8 + -fVar11;
  }
  return in_RDI;
}

Assistant:

IMATH_HOSTDEVICE Matrix33<T>
                 Euler<T>::toMatrix33 () const IMATH_NOEXCEPT
{
    int i, j, k;
    angleOrder (i, j, k);

    Vec3<T> angles;

    if (_frameStatic)
        angles = (*this);
    else
        angles = Vec3<T> (z, y, x);

    if (!_parityEven) angles *= -1.0;

    T ci = std::cos (angles.x);
    T cj = std::cos (angles.y);
    T ch = std::cos (angles.z);
    T si = std::sin (angles.x);
    T sj = std::sin (angles.y);
    T sh = std::sin (angles.z);

    T cc = ci * ch;
    T cs = ci * sh;
    T sc = si * ch;
    T ss = si * sh;

    Matrix33<T> M;

    if (_initialRepeated)
    {
        M[i][i] = cj;
        M[j][i] = sj * si;
        M[k][i] = sj * ci;
        M[i][j] = sj * sh;
        M[j][j] = -cj * ss + cc;
        M[k][j] = -cj * cs - sc;
        M[i][k] = -sj * ch;
        M[j][k] = cj * sc + cs;
        M[k][k] = cj * cc - ss;
    }
    else
    {
        M[i][i] = cj * ch;
        M[j][i] = sj * sc - cs;
        M[k][i] = sj * cc + ss;
        M[i][j] = cj * sh;
        M[j][j] = sj * ss + cc;
        M[k][j] = sj * cs - sc;
        M[i][k] = -sj;
        M[j][k] = cj * si;
        M[k][k] = cj * ci;
    }

    return M;
}